

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O2

void __thiscall Fl_FLTK_File_Chooser::~Fl_FLTK_File_Chooser(Fl_FLTK_File_Chooser *this)

{
  ~Fl_FLTK_File_Chooser(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

Fl_FLTK_File_Chooser::~Fl_FLTK_File_Chooser() {
  delete _file_chooser;
  _file_chooser = NULL;
  _filter      = strfree(_filter);
  _parsedfilt  = strfree(_parsedfilt);
  _preset_file = strfree(_preset_file);
  _prevvalue   = strfree(_prevvalue);
  _directory   = strfree(_directory);
  _errmsg      = strfree(_errmsg);
}